

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_accessors.c
# Opt level: O0

void aec_get_rsi_8(aec_stream *strm)

{
  uint32_t *puVar1;
  uchar *puVar2;
  int iVar3;
  int i;
  int rsi;
  uchar *in;
  uint32_t *out;
  aec_stream *strm_local;
  
  puVar1 = strm->state->data_raw;
  puVar2 = strm->next_in;
  iVar3 = strm->rsi * strm->block_size;
  for (i = 0; i < iVar3; i = i + 1) {
    puVar1[i] = (uint)puVar2[i];
  }
  strm->next_in = strm->next_in + iVar3;
  strm->avail_in = strm->avail_in - (long)iVar3;
  return;
}

Assistant:

void aec_get_rsi_8(struct aec_stream *strm)
{
    uint32_t *restrict out = strm->state->data_raw;
    unsigned const char *restrict in = strm->next_in;
    int rsi = strm->rsi * strm->block_size;

    for (int i = 0; i < rsi; i++)
        out[i] = (uint32_t)in[i];

    strm->next_in += rsi;
    strm->avail_in -= rsi;
}